

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O1

void av1_get_block_hash_value
               (IntraBCHashInfo *intrabc_hash_info,uint8_t *y_src,int stride,int block_size,
               uint32_t *hash_value1,uint32_t *hash_value2,int use_highbitdepth)

{
  uint32_t *puVar1;
  IntraBCHashInfo *pIVar2;
  uint *puVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  uint8_t *p_pel;
  uint8_t *puVar7;
  long lVar8;
  int x_pos;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  CRC_CALCULATOR *pCVar12;
  long lVar13;
  ulong uVar14;
  uint8_t *puVar15;
  int x_pos_1;
  bool bVar16;
  uint32_t to_hash [4];
  uint local_e8;
  uint32_t local_d8;
  uint32_t local_d4;
  uint32_t local_d0;
  uint32_t local_cc;
  ulong local_c0;
  ulong local_b8;
  IntraBCHashInfo *local_b0;
  ulong local_a8;
  ulong local_a0;
  uint8_t *local_98;
  long local_90;
  CRC_CALCULATOR *local_88;
  CRC_CALCULATOR *local_80;
  int local_74;
  uint local_70;
  uint local_6c;
  uint *local_68;
  uint32_t *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  local_80 = &intrabc_hash_info->crc_calculator1;
  local_88 = &intrabc_hash_info->crc_calculator2;
  local_c0 = (ulong)(uint)(block_size >> 1);
  local_b0 = intrabc_hash_info;
  local_68 = hash_value1;
  local_60 = hash_value2;
  if (use_highbitdepth == 0) {
    if (0 < block_size) {
      local_b8 = (ulong)(uint)block_size;
      uVar14 = 0;
      local_a8 = local_c0;
      local_98 = y_src;
      do {
        puVar15 = local_98;
        lVar13 = (uVar14 >> 1) * local_a8;
        uVar9 = 0;
        local_a0 = uVar14;
        do {
          pCVar12 = local_80;
          puVar7 = puVar15 + uVar9 + uVar14 * (long)stride;
          iVar6 = 1;
          lVar8 = 0;
          do {
            *(undefined2 *)((long)&local_d8 + (long)(int)lVar8) = *(undefined2 *)puVar7;
            lVar8 = (long)(int)lVar8 + 2;
            puVar7 = puVar7 + stride;
            iVar6 = iVar6 + -1;
          } while (iVar6 == 0);
          lVar8 = (uVar9 >> 1) + lVar13;
          uVar5 = av1_get_crc_value(pCVar12,(uint8_t *)&local_d8,4);
          intrabc_hash_info->hash_value_buffer[0][0][lVar8] = uVar5;
          uVar5 = av1_get_crc_value(local_88,(uint8_t *)&local_d8,4);
          intrabc_hash_info->hash_value_buffer[1][0][lVar8] = uVar5;
          uVar9 = uVar9 + 2;
        } while ((int)uVar9 < block_size);
        uVar14 = local_a0 + 2;
      } while (uVar14 < local_b8);
    }
  }
  else if (0 < block_size) {
    puVar15 = (uint8_t *)((long)y_src * 2);
    local_b8 = (ulong)(uint)block_size;
    local_90 = (long)stride * 4;
    uVar14 = 0;
    local_a8 = local_c0;
    do {
      lVar13 = (uVar14 >> 1) * local_a8;
      uVar9 = 0;
      local_a0 = uVar14;
      local_98 = puVar15;
      do {
        pCVar12 = local_80;
        lVar8 = 0;
        puVar7 = puVar15;
        iVar6 = 0;
        do {
          lVar8 = (long)(int)lVar8;
          lVar10 = 0;
          do {
            *(undefined2 *)((long)&local_d8 + lVar8 * 2) = *(undefined2 *)(puVar7 + lVar10 * 2);
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + 1;
          } while (lVar10 == 1);
          puVar7 = puVar7 + (long)stride * 2;
          bVar16 = iVar6 == 0;
          iVar6 = iVar6 + 1;
        } while (bVar16);
        lVar8 = (uVar9 >> 1) + lVar13;
        uVar5 = av1_get_crc_value(pCVar12,(uint8_t *)&local_d8,8);
        intrabc_hash_info->hash_value_buffer[0][0][lVar8] = uVar5;
        uVar5 = av1_get_crc_value(local_88,(uint8_t *)&local_d8,8);
        intrabc_hash_info->hash_value_buffer[1][0][lVar8] = uVar5;
        uVar9 = uVar9 + 2;
        puVar15 = puVar15 + 4;
      } while ((int)uVar9 < block_size);
      uVar14 = local_a0 + 2;
      puVar15 = local_98 + local_90;
    } while (uVar14 < local_b8);
  }
  uVar14 = 0;
  if (3 < block_size) {
    uVar11 = (uint)block_size >> 2;
    local_e8 = 1;
    iVar6 = 4;
    uVar9 = local_c0;
    pCVar12 = local_80;
    local_58 = uVar14;
    do {
      local_e8 = 1 - local_e8;
      uVar14 = (ulong)(1 - (int)local_58);
      local_74 = iVar6;
      local_58 = uVar14;
      if (uVar11 != 0) {
        local_48 = (ulong)uVar11;
        local_50 = (ulong)(uint)((int)uVar9 * 2);
        uVar9 = uVar9 & 0xffffffff;
        local_38 = local_48 * 2;
        lVar13 = 0;
        local_40 = 0;
        local_70 = uVar11;
        uVar4 = 0;
        do {
          local_6c = uVar4;
          iVar6 = (int)local_40;
          local_40 = local_48 + (long)iVar6;
          local_c0 = (long)iVar6 << 2;
          lVar8 = 0;
          local_b8 = uVar9;
          local_90 = lVar13;
          do {
            pIVar2 = local_b0;
            iVar6 = (int)lVar8;
            puVar1 = local_b0->hash_value_buffer[0][local_e8];
            local_98 = (uint8_t *)(long)((int)local_90 + iVar6);
            local_d8 = puVar1[(long)local_98];
            local_a0 = (ulong)((int)local_90 + 1 + iVar6);
            local_d4 = puVar1[local_a0];
            local_a8 = (ulong)((int)local_b8 + iVar6);
            local_d0 = puVar1[local_a8];
            iVar6 = (int)local_b8 + 1 + iVar6;
            local_cc = puVar1[iVar6];
            uVar5 = av1_get_crc_value(pCVar12,(uint8_t *)&local_d8,0x10);
            uVar9 = local_c0;
            *(uint32_t *)((long)pIVar2->hash_value_buffer[0][uVar14] + lVar8 * 2 + local_c0) = uVar5
            ;
            puVar1 = pIVar2->hash_value_buffer[1][local_e8];
            local_d8 = puVar1[(long)local_98];
            local_d4 = puVar1[local_a0];
            local_d0 = puVar1[local_a8];
            local_cc = puVar1[iVar6];
            uVar5 = av1_get_crc_value(local_88,(uint8_t *)&local_d8,0x10);
            *(uint32_t *)((long)pIVar2->hash_value_buffer[1][uVar14] + lVar8 * 2 + uVar9) = uVar5;
            lVar8 = lVar8 + 2;
            pCVar12 = local_80;
          } while (local_38 != lVar8);
          lVar13 = local_90 + local_50;
          uVar9 = local_b8 + local_50;
          uVar11 = local_70;
          uVar4 = local_6c + 1;
        } while (local_6c + 1 != local_70);
      }
      uVar9 = (ulong)uVar11;
      uVar11 = uVar11 >> 1;
      iVar6 = local_74 * 2;
    } while (iVar6 <= block_size);
    uVar14 = local_58 & 0xffffffff;
  }
  puVar1 = local_60;
  puVar3 = local_68;
  pIVar2 = local_b0;
  iVar6 = hash_block_size_to_index(block_size);
  *puVar3 = (uint)(ushort)*pIVar2->hash_value_buffer[0][uVar14] | iVar6 << 0x10;
  *puVar1 = *pIVar2->hash_value_buffer[1][uVar14];
  return;
}

Assistant:

void av1_get_block_hash_value(IntraBCHashInfo *intrabc_hash_info,
                              const uint8_t *y_src, int stride, int block_size,
                              uint32_t *hash_value1, uint32_t *hash_value2,
                              int use_highbitdepth) {
  int add_value = hash_block_size_to_index(block_size);
  assert(add_value >= 0);
  add_value <<= kSrcBits;
  const int crc_mask = (1 << kSrcBits) - 1;

  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;
  uint32_t **buf_1 = intrabc_hash_info->hash_value_buffer[0];
  uint32_t **buf_2 = intrabc_hash_info->hash_value_buffer[1];

  // 2x2 subblock hash values in current CU
  int sub_block_in_width = (block_size >> 1);
  if (use_highbitdepth) {
    uint16_t pixel_to_hash[4];
    uint16_t *y16_src = CONVERT_TO_SHORTPTR(y_src);
    for (int y_pos = 0; y_pos < block_size; y_pos += 2) {
      for (int x_pos = 0; x_pos < block_size; x_pos += 2) {
        int pos = (y_pos >> 1) * sub_block_in_width + (x_pos >> 1);
        get_pixels_in_1D_short_array_by_block_2x2(
            y16_src + y_pos * stride + x_pos, stride, pixel_to_hash);
        assert(pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        buf_1[0][pos] = av1_get_crc_value(calc_1, (uint8_t *)pixel_to_hash,
                                          sizeof(pixel_to_hash));
        buf_2[0][pos] = av1_get_crc_value(calc_2, (uint8_t *)pixel_to_hash,
                                          sizeof(pixel_to_hash));
      }
    }
  } else {
    uint8_t pixel_to_hash[4];
    for (int y_pos = 0; y_pos < block_size; y_pos += 2) {
      for (int x_pos = 0; x_pos < block_size; x_pos += 2) {
        int pos = (y_pos >> 1) * sub_block_in_width + (x_pos >> 1);
        get_pixels_in_1D_char_array_by_block_2x2(y_src + y_pos * stride + x_pos,
                                                 stride, pixel_to_hash);
        assert(pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        buf_1[0][pos] =
            av1_get_crc_value(calc_1, pixel_to_hash, sizeof(pixel_to_hash));
        buf_2[0][pos] =
            av1_get_crc_value(calc_2, pixel_to_hash, sizeof(pixel_to_hash));
      }
    }
  }

  int src_sub_block_in_width = sub_block_in_width;
  sub_block_in_width >>= 1;

  int src_idx = 1;
  int dst_idx = 0;

  // 4x4 subblock hash values to current block hash values
  uint32_t to_hash[4];
  for (int sub_width = 4; sub_width <= block_size; sub_width *= 2) {
    src_idx = 1 - src_idx;
    dst_idx = 1 - dst_idx;

    int dst_pos = 0;
    for (int y_pos = 0; y_pos < sub_block_in_width; y_pos++) {
      for (int x_pos = 0; x_pos < sub_block_in_width; x_pos++) {
        int srcPos = (y_pos << 1) * src_sub_block_in_width + (x_pos << 1);

        assert(srcPos + 1 < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        assert(srcPos + src_sub_block_in_width + 1 <
               AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        assert(dst_pos < AOM_BUFFER_SIZE_FOR_BLOCK_HASH);
        to_hash[0] = buf_1[src_idx][srcPos];
        to_hash[1] = buf_1[src_idx][srcPos + 1];
        to_hash[2] = buf_1[src_idx][srcPos + src_sub_block_in_width];
        to_hash[3] = buf_1[src_idx][srcPos + src_sub_block_in_width + 1];

        buf_1[dst_idx][dst_pos] =
            av1_get_crc_value(calc_1, (uint8_t *)to_hash, sizeof(to_hash));

        to_hash[0] = buf_2[src_idx][srcPos];
        to_hash[1] = buf_2[src_idx][srcPos + 1];
        to_hash[2] = buf_2[src_idx][srcPos + src_sub_block_in_width];
        to_hash[3] = buf_2[src_idx][srcPos + src_sub_block_in_width + 1];
        buf_2[dst_idx][dst_pos] =
            av1_get_crc_value(calc_2, (uint8_t *)to_hash, sizeof(to_hash));
        dst_pos++;
      }
    }

    src_sub_block_in_width = sub_block_in_width;
    sub_block_in_width >>= 1;
  }

  *hash_value1 = (buf_1[dst_idx][0] & crc_mask) + add_value;
  *hash_value2 = buf_2[dst_idx][0];
}